

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

Symbol * sym_RedefEqu(char *symName,int32_t value)

{
  Symbol *pSVar1;
  
  pSVar1 = sym_FindExactSymbol(symName);
  if (pSVar1 != (Symbol *)0x0) {
    if ((pSVar1->type | SYM_EQUS) == SYM_REF) {
      if (pSVar1->isBuiltin == true) {
        pSVar1 = (Symbol *)0x0;
        error("Built-in symbol \'%s\' cannot be redefined\n",symName);
      }
      else {
        updateSymbolFilename(pSVar1);
        pSVar1->type = SYM_EQU;
        (pSVar1->field_8).value = value;
      }
    }
    else {
      error("\'%s\' already defined as non-EQU at ",symName);
      dumpFilename(pSVar1);
      putc(10,_stderr);
      pSVar1 = (Symbol *)0x0;
    }
    return pSVar1;
  }
  pSVar1 = sym_AddEqu(symName,value);
  return pSVar1;
}

Assistant:

struct Symbol *sym_RedefEqu(char const *symName, int32_t value)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym)
		return sym_AddEqu(symName, value);

	if (sym_IsDefined(sym) && sym->type != SYM_EQU) {
		error("'%s' already defined as non-EQU at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL;
	} else if (sym->isBuiltin) {
		error("Built-in symbol '%s' cannot be redefined\n", symName);
		return NULL;
	}

	updateSymbolFilename(sym);
	sym->type = SYM_EQU;
	sym->value = value;

	return sym;
}